

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

BOOL get_ucp(PCRE2_SPTR8 *ptrptr,BOOL *negptr,uint *ptypeptr,uint *pdataptr,int *errorcodeptr,
            compile_block_8 *cb)

{
  byte bVar1;
  PCRE2_SPTR8 pPVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  byte local_68 [32];
  int *local_48;
  uint *local_40;
  uint *local_38;
  
  pPVar2 = *ptrptr;
  *negptr = 0;
  pbVar8 = pPVar2 + 1;
  bVar1 = pPVar2[1];
  if ((ulong)bVar1 == 0x7b) {
    if (pPVar2[2] == '^') {
      pbVar8 = pPVar2 + 2;
      *negptr = 1;
    }
    pbVar7 = local_68;
    lVar9 = 0x1f;
    while( true ) {
      pbVar4 = pbVar8 + 1;
      bVar11 = lVar9 == 0;
      lVar9 = lVar9 + -1;
      if ((bVar11) || (bVar1 = *pbVar4, pbVar8 = pbVar4, bVar1 == 0)) break;
      if (bVar1 == 0x7d) goto LAB_0010f422;
      *pbVar7 = bVar1;
      pbVar7 = pbVar7 + 1;
    }
  }
  else if ((cb->ctypes[bVar1] & 2) != 0) {
    pbVar7 = local_68 + 1;
    pbVar4 = pbVar8;
    local_68[0] = bVar1;
LAB_0010f422:
    local_48 = errorcodeptr;
    local_40 = pdataptr;
    local_38 = ptypeptr;
    *pbVar7 = 0;
    *ptrptr = pbVar4;
    iVar6 = 0;
    uVar5 = 0xa9;
    while( true ) {
      uVar10 = uVar5;
      if ((int)uVar10 <= iVar6) {
        *local_48 = 0x93;
        return 0;
      }
      uVar5 = uVar10 + iVar6 >> 1;
      iVar3 = _pcre2_strcmp_c8_8(local_68,"Any" + _pcre2_utt_8[uVar5].name_offset);
      if (iVar3 == 0) break;
      if (0 < iVar3) {
        iVar6 = uVar5 + 1;
        uVar5 = uVar10;
      }
    }
    *local_38 = (uint)_pcre2_utt_8[uVar5].type;
    *local_40 = (uint)_pcre2_utt_8[uVar5].value;
    return 1;
  }
  *errorcodeptr = 0x92;
  *ptrptr = pbVar8;
  return 0;
}

Assistant:

static BOOL
get_ucp(PCRE2_SPTR *ptrptr, BOOL *negptr, unsigned int *ptypeptr,
  unsigned int *pdataptr, int *errorcodeptr, compile_block *cb)
{
register PCRE2_UCHAR c;
int i, bot, top;
PCRE2_SPTR ptr = *ptrptr;
PCRE2_UCHAR name[32];

*negptr = FALSE;
c = *(++ptr);

/* \P or \p can be followed by a name in {}, optionally preceded by ^ for
negation. */

if (c == CHAR_LEFT_CURLY_BRACKET)
  {
  if (ptr[1] == CHAR_CIRCUMFLEX_ACCENT)
    {
    *negptr = TRUE;
    ptr++;
    }
  for (i = 0; i < (int)(sizeof(name) / sizeof(PCRE2_UCHAR)) - 1; i++)
    {
    c = *(++ptr);
    if (c == CHAR_NULL) goto ERROR_RETURN;
    if (c == CHAR_RIGHT_CURLY_BRACKET) break;
    name[i] = c;
    }
  if (c != CHAR_RIGHT_CURLY_BRACKET) goto ERROR_RETURN;
  name[i] = 0;
  }

/* Otherwise there is just one following character, which must be an ASCII
letter. */

else if (MAX_255(c) && (cb->ctypes[c] & ctype_letter) != 0)
  {
  name[0] = c;
  name[1] = 0;
  }
else goto ERROR_RETURN;

*ptrptr = ptr;

/* Search for a recognized property name using binary chop. */

bot = 0;
top = PRIV(utt_size);

while (bot < top)
  {
  int r;
  i = (bot + top) >> 1;
  r = PRIV(strcmp_c8)(name, PRIV(utt_names) + PRIV(utt)[i].name_offset);
  if (r == 0)
    {
    *ptypeptr = PRIV(utt)[i].type;
    *pdataptr = PRIV(utt)[i].value;
    return TRUE;
    }
  if (r > 0) bot = i + 1; else top = i;
  }
*errorcodeptr = ERR47;   /* Unrecognized name */
return FALSE;

ERROR_RETURN:            /* Malformed \P or \p */
*errorcodeptr = ERR46;
*ptrptr = ptr;
return FALSE;
}